

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

DdNode * Llb_ManCreateConstraints(Llb_Man_t *p,Vec_Int_t *vHints,int fUseNsVars)

{
  abctime aVar1;
  DdManager *dd;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar2;
  Aig_Man_t *pAig;
  int iVar3;
  int iVar4;
  DdNode *pDVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj_00;
  void *pvVar7;
  DdNode *n;
  abctime TimeStop;
  int Entry;
  int i;
  Aig_Obj_t *pObj;
  DdNode *bTemp;
  DdNode *bFunc;
  DdNode *bConstr;
  int fUseNsVars_local;
  Vec_Int_t *vHints_local;
  Llb_Man_t *p_local;
  
  if (vHints == (Vec_Int_t *)0x0) {
    p_local = (Llb_Man_t *)Cudd_ReadOne(p->dd);
  }
  else {
    aVar1 = p->dd->TimeStop;
    p->dd->TimeStop = 0;
    iVar3 = Aig_ManCiNum(p->pAig);
    iVar4 = Aig_ManCiNum(p->pAigGlo);
    if (iVar3 != iVar4) {
      __assert_fail("Aig_ManCiNum(p->pAig) == Aig_ManCiNum(p->pAigGlo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Reach.c"
                    ,0x1a5,"DdNode *Llb_ManCreateConstraints(Llb_Man_t *, Vec_Int_t *, int)");
    }
    Aig_ManCleanData(p->pAig);
    pDVar5 = Cudd_ReadOne(p->dd);
    pAVar6 = Aig_ManConst1(p->pAig);
    (pAVar6->field_5).pData = pDVar5;
    for (TimeStop._4_4_ = 0; iVar3 = Saig_ManPiNum(p->pAig), TimeStop._4_4_ < iVar3;
        TimeStop._4_4_ = TimeStop._4_4_ + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,TimeStop._4_4_);
      dd = p->dd;
      pVVar2 = p->vObj2Var;
      iVar3 = Aig_ObjId(pAVar6);
      iVar3 = Vec_IntEntry(pVVar2,iVar3);
      pDVar5 = Cudd_bddIthVar(dd,iVar3);
      (pAVar6->field_5).pData = pDVar5;
    }
    for (TimeStop._4_4_ = 0; iVar3 = Saig_ManRegNum(p->pAig), TimeStop._4_4_ < iVar3;
        TimeStop._4_4_ = TimeStop._4_4_ + 1) {
      p_00 = p->pAig->vCis;
      iVar3 = Saig_ManPiNum(p->pAig);
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00,TimeStop._4_4_ + iVar3);
      if (fUseNsVars == 0) {
        pVVar2 = p->vObj2Var;
        iVar3 = Aig_ObjId(pAVar6);
        TimeStop._0_4_ = Vec_IntEntry(pVVar2,iVar3);
      }
      else {
        pVVar2 = p->vObj2Var;
        pObj_00 = Saig_ObjLoToLi(p->pAig,pAVar6);
        iVar3 = Aig_ObjId(pObj_00);
        TimeStop._0_4_ = Vec_IntEntry(pVVar2,iVar3);
      }
      pDVar5 = Cudd_bddIthVar(p->dd,(int)TimeStop);
      (pAVar6->field_5).pData = pDVar5;
    }
    Aig_ManCleanData(p->pAigGlo);
    pDVar5 = Cudd_ReadOne(p->dd);
    pAVar6 = Aig_ManConst1(p->pAigGlo);
    (pAVar6->field_5).pData = pDVar5;
    for (TimeStop._4_4_ = 0; iVar3 = Vec_PtrSize(p->pAigGlo->vCis), TimeStop._4_4_ < iVar3;
        TimeStop._4_4_ = TimeStop._4_4_ + 1) {
      pvVar7 = Vec_PtrEntry(p->pAigGlo->vCis,TimeStop._4_4_);
      pAVar6 = Aig_ManCi(p->pAig,TimeStop._4_4_);
      *(anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 *)((long)pvVar7 + 0x28) = pAVar6->field_5;
    }
    bFunc = Cudd_ReadOne(p->dd);
    Cudd_Ref(bFunc);
    for (TimeStop._4_4_ = 0; iVar3 = Vec_IntSize(vHints), TimeStop._4_4_ < iVar3;
        TimeStop._4_4_ = TimeStop._4_4_ + 1) {
      iVar3 = Vec_IntEntry(vHints,TimeStop._4_4_);
      if ((iVar3 == 0) || (iVar3 == 1)) {
        pAig = p->pAigGlo;
        pAVar6 = Aig_ManObj(p->pAigGlo,TimeStop._4_4_);
        pDVar5 = Llb_ManConstructOutBdd(pAig,pAVar6,p->dd);
        Cudd_Ref(pDVar5);
        n = Cudd_bddAnd(p->dd,bFunc,(DdNode *)((ulong)pDVar5 ^ (long)iVar3));
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,bFunc);
        Cudd_RecursiveDeref(p->dd,(DdNode *)((ulong)pDVar5 ^ (long)iVar3));
        bFunc = n;
      }
    }
    Cudd_Deref(bFunc);
    p->dd->TimeStop = aVar1;
    p_local = (Llb_Man_t *)bFunc;
  }
  return (DdNode *)p_local;
}

Assistant:

DdNode * Llb_ManCreateConstraints( Llb_Man_t * p, Vec_Int_t * vHints, int fUseNsVars )
{
    DdNode * bConstr, * bFunc, * bTemp;
    Aig_Obj_t * pObj;
    int i, Entry;
    abctime TimeStop;
    if ( vHints == NULL )
        return Cudd_ReadOne( p->dd );
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    assert( Aig_ManCiNum(p->pAig) == Aig_ManCiNum(p->pAigGlo) );
    // assign const and PI nodes to the original AIG
    Aig_ManCleanData( p->pAig );
    Aig_ManConst1( p->pAig )->pData = Cudd_ReadOne( p->dd );
    Saig_ManForEachPi( p->pAig, pObj, i )
        pObj->pData = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var,Aig_ObjId(pObj)) );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        if ( fUseNsVars )
            Entry = Vec_IntEntry( p->vObj2Var, Aig_ObjId(Saig_ObjLoToLi(p->pAig, pObj)) );
        else
            Entry = Vec_IntEntry( p->vObj2Var, Aig_ObjId(pObj) );
        pObj->pData = Cudd_bddIthVar( p->dd, Entry );
    }
    // transfer them to the global AIG
    Aig_ManCleanData( p->pAigGlo );
    Aig_ManConst1( p->pAigGlo )->pData = Cudd_ReadOne( p->dd );
    Aig_ManForEachCi( p->pAigGlo, pObj, i )
        pObj->pData = Aig_ManCi(p->pAig, i)->pData;
    // derive consraints
    bConstr = Cudd_ReadOne( p->dd );   Cudd_Ref( bConstr );
    Vec_IntForEachEntry( vHints, Entry, i )
    {
        if ( Entry != 0 && Entry != 1 )
            continue;
        bFunc = Llb_ManConstructOutBdd( p->pAigGlo, Aig_ManObj(p->pAigGlo, i), p->dd );  Cudd_Ref( bFunc );
        bFunc = Cudd_NotCond( bFunc, Entry ); // restrict to not constraint
        // make the product
        bConstr = Cudd_bddAnd( p->dd, bTemp = bConstr, bFunc );                          Cudd_Ref( bConstr );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bFunc );
    }
    Cudd_Deref( bConstr );
    p->dd->TimeStop = TimeStop;
    return bConstr;
}